

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsidebar_p.cpp
# Opt level: O1

void QUrlModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QObject *this;
  iterator path;
  iterator iVar1;
  long lVar2;
  QString *args;
  long in_FS_OFFSET;
  undefined1 *puStack_a8;
  undefined1 *puStack_a0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_98;
  QArrayData *pQStack_90;
  char16_t *pcStack_88;
  qsizetype qStack_80;
  undefined1 *puStack_78;
  undefined1 *puStack_70;
  QAbstractItemModel *pQStack_68;
  QArrayDataPointer<QString> QStack_58;
  long lStack_38;
  
  if (_c == InvokeMetaMethod) {
    if (_id == 1) {
      lStack_38 = *(long *)(in_FS_OFFSET + 0x28);
      QStack_58.d = (Data *)0x0;
      QStack_58.ptr = (QString *)0x0;
      QStack_58.size = 0;
      this = _o + 0x20;
      QList<QString>::reserve((QList<QString> *)&QStack_58,*(qsizetype *)(_o + 0x30));
      if (*(long *)(_o + 0x30) != 0) {
        args = (QString *)(*(long *)(_o + 0x28) + 0x18);
        lVar2 = *(long *)(_o + 0x30) * 0x30;
        do {
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)&QStack_58,QStack_58.size,args);
          QList<QString>::end((QList<QString> *)&QStack_58);
          args = args + 2;
          lVar2 = lVar2 + -0x30;
        } while (lVar2 != 0);
      }
      QList<QUrlModel::WatchItem>::clear((QList<QUrlModel::WatchItem> *)this);
      path = QList<QString>::begin((QList<QString> *)&QStack_58);
      iVar1 = QList<QString>::end((QList<QString> *)&QStack_58);
      if (path.i != iVar1.i) {
        do {
          pQStack_68 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          puStack_78 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
          QFileSystemModel::index((QString *)&puStack_78,(int)*(undefined8 *)(_o + 0x18));
          tStack_98.ptr = pQStack_68;
          puStack_a8 = puStack_78;
          puStack_a0 = puStack_70;
          pQStack_90 = &(((path.i)->d).d)->super_QArrayData;
          pcStack_88 = ((path.i)->d).ptr;
          qStack_80 = ((path.i)->d).size;
          if (pQStack_90 != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&pQStack_90->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
                 (((QArrayData *)&pQStack_90->ref_)->ref_)._q_value.super___atomic_base<int>._M_i +
                 1;
            UNLOCK();
          }
          QtPrivate::QMovableArrayOps<QUrlModel::WatchItem>::emplace<QUrlModel::WatchItem>
                    ((QMovableArrayOps<QUrlModel::WatchItem> *)this,*(qsizetype *)(_o + 0x30),
                     (WatchItem *)&puStack_a8);
          QList<QUrlModel::WatchItem>::end((QList<QUrlModel::WatchItem> *)this);
          if (pQStack_90 != (QArrayData *)0x0) {
            LOCK();
            (pQStack_90->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQStack_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQStack_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQStack_90,2,0x10);
            }
          }
          if (((-1 < (int)puStack_78) && (-1 < (long)puStack_78)) &&
             (pQStack_68 != (QAbstractItemModel *)0x0)) {
            changed((QUrlModel *)_o,path.i);
          }
          path.i = path.i + 1;
        } while (path.i != iVar1.i);
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&QStack_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == lStack_38) {
        return;
      }
      __stack_chk_fail();
    }
    if (_id == 0) {
      dataChanged((QUrlModel *)_o,(QModelIndex *)_a[1],(QModelIndex *)_a[2]);
      return;
    }
  }
  return;
}

Assistant:

void QUrlModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QUrlModel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->dataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 1: _t->layoutChanged(); break;
        default: ;
        }
    }
}